

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

TriangleMesh *
pbrt::LoopSubdivide(Transform *renderFromObject,bool reverseOrientation,int nLevels,
                   span<const_int> vertexIndices,span<const_pbrt::Point3<float>_> p,Allocator alloc)

{
  value_type pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  mapped_type pSVar31;
  bool bVar32;
  int iVar33;
  ulong uVar34;
  size_t sVar35;
  Point3<float> *p_00;
  type pSVar36;
  reference ppSVar37;
  reference ppSVar38;
  reference pSVar39;
  SDVertex *pSVar40;
  SDFace *pSVar41;
  reference ppSVar42;
  reference ppSVar43;
  mapped_type *ppSVar44;
  size_type sVar45;
  reference pvVar46;
  mapped_type *pmVar47;
  TriangleMesh *pTVar48;
  long lVar49;
  int in_EDX;
  byte in_SIL;
  Transform *in_RDI;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar50;
  undefined8 uVar56;
  undefined1 auVar53 [64];
  undefined8 uVar57;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar58 [56];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  pair<std::_Rb_tree_const_iterator<pbrt::SDEdge>,_bool> pVar59;
  Point3f PVar60;
  Point3<float> PVar61;
  Vector3<float> VVar62;
  int j_4;
  size_t i_9;
  size_t i_8;
  map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
  usedVerts;
  size_t totVerts;
  int *vp_1;
  vector<int,_std::allocator<int>_> verts_1;
  size_t ntris;
  Float wt;
  int k_2;
  Float theta;
  int j_3;
  int valence;
  Vector3f T;
  Vector3f S;
  SDVertex *vertex_3;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *__range1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pRing;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> Ns;
  size_t i_7;
  size_t i_6;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pLimit;
  SDVertex *vert_1;
  int j_2;
  SDFace *face_3;
  iterator __end2_6;
  iterator __begin2_6;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *__range2_6;
  SDFace *f2;
  int j_1;
  SDFace *face_2;
  iterator __end2_5;
  iterator __begin2_5;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *__range2_5;
  int vertNum;
  SDVertex *vertex_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *__range2_4;
  SDVertex *vert;
  SDEdge edge;
  int k_1;
  SDFace *face_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *__range2_3;
  map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
  edgeVerts;
  SDVertex *vertex_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *__range2_2;
  int k;
  SDFace *face;
  iterator __end2_1;
  iterator __begin2_1;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *__range2_1;
  SDVertex *vertex;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *__range2;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> newVertices;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> newFaces;
  int i_5;
  Allocator vertexFaceAllocator;
  monotonic_buffer_resource resource;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> v;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> f;
  SDFace *f_3;
  SDVertex *v_2;
  size_t i_4;
  SDEdge e;
  int v1;
  int v0;
  int edgeNum;
  SDFace *f_2;
  int i_3;
  set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> edges;
  SDVertex *v_1;
  int j;
  SDFace *f_1;
  size_t i_2;
  int *vp;
  int i_1;
  unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_> fs;
  size_t nFaces;
  int i;
  unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_> verts;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> faces;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> vertices;
  SDVertex *in_stack_ffffffffffffef88;
  monotonic_buffer_resource *in_stack_ffffffffffffef90;
  monotonic_buffer_resource *this;
  SDVertex *in_stack_ffffffffffffef98;
  SDFace *in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa8 [16];
  undefined1 auVar63 [16];
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_ffffffffffffefb8;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_ffffffffffffefc0;
  vector<int,_std::allocator<int>_> *args_2;
  key_type *in_stack_ffffffffffffefc8;
  map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
  *in_stack_ffffffffffffefd0;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *in_stack_ffffffffffffefd8;
  size_t *this_00;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *in_stack_ffffffffffffefe0;
  size_t in_stack_ffffffffffffefe8;
  undefined4 in_stack_ffffffffffffeff0;
  mapped_type in_stack_ffffffffffffeff4;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_ffffffffffffeff8;
  vector<int,_std::allocator<int>_> *args_7;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff030;
  undefined4 in_stack_fffffffffffff034;
  Float in_stack_fffffffffffff13c;
  undefined4 in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff144;
  Float in_stack_fffffffffffff15c;
  undefined4 in_stack_fffffffffffff160;
  undefined4 in_stack_fffffffffffff164;
  SDFace *local_c48;
  SDFace *local_c28;
  vector<int,_std::allocator<int>_> local_9f8;
  monotonic_buffer_resource local_9d8;
  _List_node_base *local_950;
  int *local_948;
  _List_node_base *local_920;
  undefined8 local_918;
  float local_910;
  undefined8 local_908;
  float local_900;
  undefined8 local_8f0;
  float local_8e8;
  undefined8 local_8dc;
  float local_8d4;
  undefined8 local_8d0;
  float local_8c8;
  undefined8 local_8c0;
  float local_8b8;
  Vector3<float> local_8b4;
  float local_8a8;
  int local_8a4;
  undefined8 local_8a0;
  float local_898;
  undefined8 local_890;
  float local_888;
  undefined8 local_880;
  float local_878;
  undefined8 local_870;
  float local_868;
  undefined8 local_860;
  undefined4 local_858;
  float local_854;
  undefined8 local_850;
  float local_848;
  undefined8 local_840;
  float local_838;
  undefined8 local_830;
  float local_828;
  undefined8 local_820;
  float local_818;
  undefined8 local_810;
  float local_808;
  undefined8 local_800;
  float local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  float local_7d8;
  undefined8 local_7d0;
  float local_7c8;
  undefined8 local_7c0;
  float local_7b8;
  undefined8 local_7b0;
  float local_7a8;
  undefined8 local_7a0;
  float local_798;
  undefined8 local_790;
  float local_788;
  undefined8 local_780;
  float local_778;
  undefined8 local_770;
  float local_768;
  undefined8 local_760;
  float local_758;
  undefined8 local_750;
  float local_748;
  undefined8 local_740;
  float local_738;
  undefined8 local_734;
  float local_72c;
  undefined8 local_728;
  float local_720;
  undefined8 local_714;
  float local_70c;
  undefined8 local_708;
  float local_700;
  undefined8 local_6f8;
  float local_6f0;
  undefined8 local_6e8;
  float local_6e0;
  undefined8 local_6d8;
  float local_6d0;
  undefined8 local_6c8;
  float local_6c0;
  undefined8 local_6bc;
  float local_6b4;
  undefined8 local_6b0;
  float local_6a8;
  undefined8 local_69c;
  float local_694;
  Tuple3<pbrt::Vector3,_float> local_690 [2];
  Tuple3<pbrt::Vector3,_float> local_670;
  Tuple3<pbrt::Vector3,_float> local_660 [2];
  Tuple3<pbrt::Vector3,_float> local_640;
  int local_630;
  int local_62c;
  undefined8 local_628;
  float local_620;
  undefined8 local_61c;
  float local_614;
  SDVertex *local_610;
  SDVertex **local_608;
  __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
  local_600;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *local_5f8;
  undefined8 local_5e8;
  undefined4 local_5e0;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_5d8 [2];
  ulong local_5a8;
  undefined8 local_5a0;
  float local_598;
  undefined8 local_58c;
  float local_584;
  undefined8 local_580;
  float local_578;
  undefined8 local_56c;
  float local_564;
  ulong local_560;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_550 [2];
  SDVertex *local_510;
  int local_504;
  SDFace *local_500;
  SDFace **local_4f8;
  __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
  local_4f0;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *local_4e8;
  SDFace *local_4e0;
  int local_4d4;
  SDFace *local_4d0;
  SDFace **local_4c8;
  __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
  local_4c0;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *local_4b8;
  int local_4ac;
  SDVertex *local_4a8;
  SDVertex **local_4a0;
  __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
  local_498;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *local_490;
  Tuple3<pbrt::Point3,_float> local_488;
  Tuple3<pbrt::Point3,_float> local_478;
  Tuple3<pbrt::Point3,_float> local_468;
  Tuple3<pbrt::Point3,_float> local_458;
  Tuple3<pbrt::Point3,_float> local_448;
  Tuple3<pbrt::Point3,_float> local_438;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  Tuple3<pbrt::Point3,_float> local_408;
  Tuple3<pbrt::Point3,_float> local_3f8;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  mapped_type local_3c8;
  int local_394;
  SDFace *local_390;
  SDFace **local_388;
  __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
  local_380;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *local_378;
  undefined8 local_340;
  float local_338;
  undefined8 local_32c;
  float local_324;
  undefined8 local_320;
  float local_318;
  undefined8 local_30c;
  float local_304;
  undefined8 local_300;
  float local_2f8;
  undefined8 local_2ec;
  float local_2e4;
  SDVertex *local_2e0;
  SDVertex **local_2d8;
  __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
  local_2d0;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *local_2c8;
  int local_2bc;
  SDFace *local_2b8;
  SDFace **local_2b0;
  __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
  local_2a8;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *local_2a0;
  SDVertex *local_298;
  SDVertex **local_290;
  __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
  local_288;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *local_280;
  int local_244;
  polymorphic_allocator<std::byte> local_240;
  memory_resource local_238 [12];
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> local_1d8;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> local_1c0;
  SDFace *local_1a8;
  value_type local_1a0;
  ulong local_198;
  _Base_ptr local_190;
  _Base_ptr local_188;
  undefined1 local_180;
  _Self local_178;
  _Self local_170;
  undefined1 local_168 [32];
  int local_148;
  int local_134;
  int local_130;
  int local_12c;
  value_type local_128;
  int local_11c;
  SDVertex *local_e8;
  int local_dc;
  value_type local_d8;
  size_type local_d0;
  int *local_c8;
  type local_c0;
  int local_b4;
  ulong local_a8;
  type local_a0;
  undefined1 local_98 [32];
  bool local_78;
  bool bStack_77;
  int local_70;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> local_58;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> local_40;
  int local_28;
  byte local_21;
  Transform *local_20;
  span<const_int> local_10;
  
  local_21 = in_SIL & 1;
  local_28 = in_EDX;
  local_20 = in_RDI;
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector
            ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)0x8a3217);
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector
            ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)0x8a3224);
  pstd::span<const_pbrt::Point3<float>_>::size((span<const_pbrt::Point3<float>_> *)&stack0x00000008)
  ;
  std::make_unique<pbrt::SDVertex[]>(in_stack_ffffffffffffefe8);
  for (local_70 = 0; uVar34 = (ulong)local_70,
      sVar35 = pstd::span<const_pbrt::Point3<float>_>::size
                         ((span<const_pbrt::Point3<float>_> *)&stack0x00000008), uVar34 < sVar35;
      local_70 = local_70 + 1) {
    p_00 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                     ((span<const_pbrt::Point3<float>_> *)&stack0x00000008,(long)local_70);
    SDVertex::SDVertex((SDVertex *)local_98,p_00);
    pSVar36 = std::unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_>::operator[]
                        ((unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_> *)
                         in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88);
    pSVar36->regular = local_78;
    pSVar36->boundary = bStack_77;
    pSVar36->p = (Point3f)local_98._0_12_;
    *(undefined4 *)&pSVar36->field_0xc = local_98._12_4_;
    pSVar36->startFace = (SDFace *)local_98._16_8_;
    pSVar36->child = (SDVertex *)local_98._24_8_;
    local_a0 = std::unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_>::operator[]
                         ((unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_> *)
                          in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88);
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::push_back
              ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
               in_stack_ffffffffffffef90,(value_type *)in_stack_ffffffffffffef88);
  }
  sVar35 = pstd::span<const_int>::size(&local_10);
  local_a8 = sVar35 / 3;
  std::make_unique<pbrt::SDFace[]>((size_t)in_stack_ffffffffffffefd8);
  for (local_b4 = 0; (ulong)(long)local_b4 < local_a8; local_b4 = local_b4 + 1) {
    local_c0 = std::unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_>::operator[]
                         ((unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_> *)
                          in_stack_ffffffffffffef90,(size_t)in_stack_ffffffffffffef88);
    std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::push_back
              ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)in_stack_ffffffffffffef90,
               (value_type *)in_stack_ffffffffffffef88);
  }
  local_c8 = pstd::span<const_int>::data(&local_10);
  for (local_d0 = 0; local_d0 < local_a8; local_d0 = local_d0 + 1) {
    ppSVar37 = std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator[]
                         (&local_58,local_d0);
    local_d8 = *ppSVar37;
    for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
      ppSVar38 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                           (&local_40,(long)local_c8[local_dc]);
      local_e8 = *ppSVar38;
      local_d8->v[local_dc] = local_e8;
      local_e8->startFace = local_d8;
    }
    local_c8 = local_c8 + 3;
  }
  std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::set
            ((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> *)0x8a35b0);
  for (local_11c = 0; (ulong)(long)local_11c < local_a8; local_11c = local_11c + 1) {
    ppSVar37 = std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator[]
                         (&local_58,(long)local_11c);
    local_128 = *ppSVar37;
    for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
      local_130 = local_12c;
      local_134 = local_12c + 1 + ((local_12c + 1) / 3) * -3;
      SDEdge::SDEdge((SDEdge *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                     (SDVertex *)in_stack_ffffffffffffef90);
      local_170._M_node =
           (_Base_ptr)
           std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::find
                     ((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> *)
                      in_stack_ffffffffffffef98,(key_type *)in_stack_ffffffffffffef90);
      local_178._M_node =
           (_Base_ptr)
           std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::end
                     ((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> *)
                      in_stack_ffffffffffffef88);
      bVar32 = std::operator==(&local_170,&local_178);
      if (bVar32) {
        local_168._16_8_ = local_128;
        local_148 = local_12c;
        pVar59 = std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::
                 insert(in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_);
        local_188 = (_Base_ptr)pVar59.first._M_node;
        local_180 = pVar59.second;
      }
      else {
        local_190 = (_Base_ptr)
                    std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::
                    find((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                          *)in_stack_ffffffffffffef98,(key_type *)in_stack_ffffffffffffef90);
        pSVar39 = std::_Rb_tree_const_iterator<pbrt::SDEdge>::operator*
                            ((_Rb_tree_const_iterator<pbrt::SDEdge> *)0x8a379d);
        local_148 = pSVar39->f0edgeNum;
        local_168._0_8_ = pSVar39->v[0];
        local_168._8_8_ = pSVar39->v[1];
        local_168._16_8_ = pSVar39->f[0];
        local_168._24_8_ = pSVar39->f[1];
        ((SDFace **)(local_168._16_8_ + 0x18))[local_148] = local_128;
        local_128->f[local_12c] = (SDFace *)local_168._16_8_;
        std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::erase
                  ((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> *)
                   in_stack_ffffffffffffef90,(key_type *)in_stack_ffffffffffffef88);
      }
    }
  }
  for (local_198 = 0; uVar34 = local_198,
      sVar35 = pstd::span<const_pbrt::Point3<float>_>::size
                         ((span<const_pbrt::Point3<float>_> *)&stack0x00000008), uVar34 < sVar35;
      local_198 = local_198 + 1) {
    ppSVar38 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                         (&local_40,local_198);
    local_1a0 = *ppSVar38;
    local_1a8 = local_1a0->startFace;
    do {
      local_1a8 = SDFace::nextFace((SDFace *)in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
      bVar32 = false;
      if (local_1a8 != (SDFace *)0x0) {
        bVar32 = local_1a8 != local_1a0->startFace;
      }
    } while (bVar32);
    local_1a0->boundary = local_1a8 == (SDFace *)0x0;
    if (((local_1a0->boundary & 1U) == 0) &&
       (iVar33 = SDVertex::valence(in_stack_ffffffffffffef98), iVar33 == 6)) {
      local_1a0->regular = true;
    }
    else if (((local_1a0->boundary & 1U) == 0) ||
            (iVar33 = SDVertex::valence(in_stack_ffffffffffffef98), iVar33 != 4)) {
      local_1a0->regular = false;
    }
    else {
      local_1a0->regular = true;
    }
  }
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector
            (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector
            ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
             in_stack_ffffffffffffefe0,
             (vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
             in_stack_ffffffffffffefd8);
  pstd::pmr::monotonic_buffer_resource::monotonic_buffer_resource(in_stack_ffffffffffffef90);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(&local_240,local_238);
  for (local_244 = 0; local_244 < local_28; local_244 = local_244 + 1) {
    std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector
              ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)0x8a3a65);
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector
              ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)0x8a3a72);
    local_280 = &local_1d8;
    local_288._M_current =
         (SDVertex **)
         std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::begin
                   ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                    in_stack_ffffffffffffef88);
    local_290 = (SDVertex **)
                std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::end
                          ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar42 = __gnu_cxx::
                 __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                 ::operator*(&local_288);
      local_298 = *ppSVar42;
      pSVar40 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDVertex>
                          ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffef90);
      local_298->child = pSVar40;
      local_298->child->regular = (bool)(local_298->regular & 1);
      local_298->child->boundary = (bool)(local_298->boundary & 1);
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::push_back
                ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                 in_stack_ffffffffffffefa0,(value_type *)in_stack_ffffffffffffef98);
      __gnu_cxx::
      __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
      ::operator++(&local_288);
    }
    local_2a0 = &local_1c0;
    local_2a8._M_current =
         (SDFace **)
         std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::begin
                   ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                    in_stack_ffffffffffffef88);
    local_2b0 = (SDFace **)
                std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::end
                          ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar43 = __gnu_cxx::
                 __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                 ::operator*(&local_2a8);
      local_2b8 = *ppSVar43;
      for (local_2bc = 0; local_2bc < 4; local_2bc = local_2bc + 1) {
        pSVar41 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDFace>
                            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffef90);
        local_2b8->children[local_2bc] = pSVar41;
        std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::push_back
                  ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                   in_stack_ffffffffffffefa0,(value_type *)in_stack_ffffffffffffef98);
      }
      __gnu_cxx::
      __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
      ::operator++(&local_2a8);
    }
    local_2c8 = &local_1d8;
    local_2d0._M_current =
         (SDVertex **)
         std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::begin
                   ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                    in_stack_ffffffffffffef88);
    local_2d8 = (SDVertex **)
                std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::end
                          ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar42 = __gnu_cxx::
                 __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                 ::operator*(&local_2d0);
      local_2e0 = *ppSVar42;
      if ((local_2e0->boundary & 1U) == 0) {
        if ((local_2e0->regular & 1U) == 0) {
          iVar33 = SDVertex::valence(in_stack_ffffffffffffef98);
          beta(iVar33);
          uVar56 = 0;
          PVar60 = weightOneRing((SDVertex *)
                                 CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                                 in_stack_fffffffffffff13c);
          local_318 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
          auVar28._8_8_ = uVar56;
          auVar28._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
          local_320 = vmovlpd_avx(auVar28);
          pSVar40 = local_2e0->child;
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_320;
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_320 >> 0x20);
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.z = local_318;
          local_30c = local_320;
          local_304 = local_318;
        }
        else {
          uVar56 = 0;
          PVar60 = weightOneRing((SDVertex *)
                                 CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                                 in_stack_fffffffffffff13c);
          local_2f8 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
          auVar29._8_8_ = uVar56;
          auVar29._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
          local_300 = vmovlpd_avx(auVar29);
          pSVar40 = local_2e0->child;
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_300;
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_300 >> 0x20);
          (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.z = local_2f8;
          local_2ec = local_300;
          local_2e4 = local_2f8;
        }
      }
      else {
        uVar56 = 0;
        PVar60 = weightBoundary((SDVertex *)
                                CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                                in_stack_fffffffffffff15c);
        local_338 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
        auVar27._8_8_ = uVar56;
        auVar27._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_340 = vmovlpd_avx(auVar27);
        pSVar40 = local_2e0->child;
        (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_340;
        (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_340 >> 0x20);
        (pSVar40->p).super_Tuple3<pbrt::Point3,_float>.z = local_338;
        local_32c = local_340;
        local_324 = local_338;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
      ::operator++(&local_2d0);
    }
    std::
    map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
    ::map((map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
           *)0x8a3f69);
    local_378 = &local_1c0;
    local_380._M_current =
         (SDFace **)
         std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::begin
                   ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                    in_stack_ffffffffffffef88);
    local_388 = (SDFace **)
                std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::end
                          ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar43 = __gnu_cxx::
                 __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                 ::operator*(&local_380);
      local_390 = *ppSVar43;
      for (local_394 = 0; local_394 < 3; local_394 = local_394 + 1) {
        SDEdge::SDEdge((SDEdge *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                       (SDVertex *)in_stack_ffffffffffffef90);
        ppSVar44 = std::
                   map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                   ::operator[](in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        local_3c8 = *ppSVar44;
        if (local_3c8 == (mapped_type)0x0) {
          local_3c8 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDVertex>
                                ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffef90);
          std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::push_back
                    ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                     in_stack_ffffffffffffefa0,(value_type *)in_stack_ffffffffffffef98);
          local_3c8->regular = true;
          local_3c8->boundary = local_390->f[local_394] == (SDFace *)0x0;
          local_3c8->startFace = local_390->children[3];
          if ((local_3c8->boundary & 1U) == 0) {
            uVar56 = 0;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_420 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar24._8_8_ = uVar56;
            auVar24._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_428 = vmovlpd_avx(auVar24);
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.z = local_420;
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_428;
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.y =
                 (float)(int)((ulong)local_428 >> 0x20);
            uVar56 = 0;
            local_418 = local_428;
            local_410 = local_420;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_448.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar23._8_8_ = uVar56;
            auVar23._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_448._0_8_ = vmovlpd_avx(auVar23);
            local_438._0_8_ = local_448._0_8_;
            local_438.z = local_448.z;
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)local_3c8,(Point3<float> *)&local_438);
            SDFace::otherVert(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                              (SDVertex *)in_stack_ffffffffffffef90);
            uVar56 = 0;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_468.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar22._8_8_ = uVar56;
            auVar22._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_468._0_8_ = vmovlpd_avx(auVar22);
            local_458._0_8_ = local_468._0_8_;
            local_458.z = local_468.z;
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)local_3c8,(Point3<float> *)&local_458);
            SDFace::otherVert(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                              (SDVertex *)in_stack_ffffffffffffef90);
            uVar56 = 0;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_488.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar63._8_8_ = uVar56;
            auVar63._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_488._0_8_ = vmovlpd_avx(auVar63);
            local_478._0_8_ = local_488._0_8_;
            local_478.z = local_488.z;
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)local_3c8,(Point3<float> *)&local_478);
          }
          else {
            uVar56 = 0;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_3e0 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar26._8_8_ = uVar56;
            auVar26._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_3e8 = vmovlpd_avx(auVar26);
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.z = local_3e0;
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_3e8;
            (local_3c8->p).super_Tuple3<pbrt::Point3,_float>.y =
                 (float)(int)((ulong)local_3e8 >> 0x20);
            uVar56 = 0;
            local_3d8 = local_3e8;
            local_3d0 = local_3e0;
            PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
            local_408.z = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
            auVar25._8_8_ = uVar56;
            auVar25._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_408._0_8_ = vmovlpd_avx(auVar25);
            local_3f8._0_8_ = local_408._0_8_;
            local_3f8.z = local_408.z;
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)local_3c8,(Point3<float> *)&local_3f8);
          }
          pSVar31 = local_3c8;
          ppSVar44 = std::
                     map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                     ::operator[](in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          *ppSVar44 = pSVar31;
        }
      }
      __gnu_cxx::
      __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
      ::operator++(&local_380);
    }
    local_490 = &local_1d8;
    local_498._M_current =
         (SDVertex **)
         std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::begin
                   ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                    in_stack_ffffffffffffef88);
    local_4a0 = (SDVertex **)
                std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::end
                          ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar42 = __gnu_cxx::
                 __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                 ::operator*(&local_498);
      local_4a8 = *ppSVar42;
      local_4ac = SDFace::vnum(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
      local_4a8->child->startFace = local_4a8->startFace->children[local_4ac];
      __gnu_cxx::
      __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
      ::operator++(&local_498);
    }
    local_4b8 = &local_1c0;
    local_4c0._M_current =
         (SDFace **)
         std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::begin
                   ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                    in_stack_ffffffffffffef88);
    local_4c8 = (SDFace **)
                std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::end
                          ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar43 = __gnu_cxx::
                 __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                 ::operator*(&local_4c0);
      local_4d0 = *ppSVar43;
      for (local_4d4 = 0; local_4d4 < 3; local_4d4 = local_4d4 + 1) {
        local_4d0->children[3]->f[local_4d4] = local_4d0->children[(local_4d4 + 1) % 3];
        local_4d0->children[local_4d4]->f[(local_4d4 + 1) % 3] = local_4d0->children[3];
        pSVar41 = local_4d0->f[local_4d4];
        if (pSVar41 == (SDFace *)0x0) {
          local_c28 = (SDFace *)0x0;
        }
        else {
          local_4e0 = pSVar41;
          iVar33 = SDFace::vnum(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
          local_c28 = pSVar41->children[iVar33];
        }
        local_4d0->children[local_4d4]->f[local_4d4] = local_c28;
        pSVar41 = local_4d0->f[(local_4d4 + 2) % 3];
        local_4e0 = pSVar41;
        if (pSVar41 == (SDFace *)0x0) {
          local_c48 = (SDFace *)0x0;
        }
        else {
          iVar33 = SDFace::vnum(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
          local_c48 = pSVar41->children[iVar33];
        }
        local_4d0->children[local_4d4]->f[(local_4d4 + 2) % 3] = local_c48;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
      ::operator++(&local_4c0);
    }
    local_4e8 = &local_1c0;
    local_4f0._M_current =
         (SDFace **)
         std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::begin
                   ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                    in_stack_ffffffffffffef88);
    local_4f8 = (SDFace **)
                std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::end
                          ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
                           in_stack_ffffffffffffef88);
    while (bVar32 = __gnu_cxx::operator!=
                              ((__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef90,
                               (__normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                                *)in_stack_ffffffffffffef88), bVar32) {
      ppSVar43 = __gnu_cxx::
                 __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
                 ::operator*(&local_4f0);
      local_500 = *ppSVar43;
      for (local_504 = 0; local_504 < 3; local_504 = local_504 + 1) {
        lVar49 = (long)local_504;
        local_500->children[lVar49]->v[lVar49] = local_500->v[lVar49]->child;
        SDEdge::SDEdge((SDEdge *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                       (SDVertex *)in_stack_ffffffffffffef90);
        ppSVar44 = std::
                   map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                   ::operator[](in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        local_510 = *ppSVar44;
        local_500->children[local_504]->v[(local_504 + 1) % 3] = local_510;
        local_500->children[(local_504 + 1) % 3]->v[local_504] = local_510;
        local_500->children[3]->v[local_504] = local_510;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::SDFace_**,_std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>_>
      ::operator++(&local_4f0);
    }
    std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator=
              ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)
               CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               in_stack_fffffffffffff028);
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator=
              ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
               CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
               in_stack_fffffffffffff028);
    std::
    map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
    ::~map((map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
            *)0x8a4b6a);
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~vector
              ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
               in_stack_ffffffffffffefa0);
    std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~vector
              ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)in_stack_ffffffffffffefa0)
    ;
  }
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::size(&local_1d8);
  std::allocator<pbrt::Point3<float>_>::allocator((allocator<pbrt::Point3<float>_> *)0x8a4be3);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_,
             (allocator_type *)in_stack_ffffffffffffefa0);
  std::allocator<pbrt::Point3<float>_>::~allocator((allocator<pbrt::Point3<float>_> *)0x8a4c0f);
  for (local_560 = 0; uVar34 = local_560,
      sVar45 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::size(&local_1d8),
      uVar34 < sVar45; local_560 = local_560 + 1) {
    ppSVar38 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                         (&local_1d8,local_560);
    if (((*ppSVar38)->boundary & 1U) == 0) {
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                (&local_1d8,local_560);
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                (&local_1d8,local_560);
      SDVertex::valence(in_stack_ffffffffffffef98);
      loopGamma(0);
      uVar56 = 0;
      PVar60 = weightOneRing((SDVertex *)
                             CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140),
                             in_stack_fffffffffffff13c);
      local_598 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      auVar20._8_8_ = uVar56;
      auVar20._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_5a0 = vmovlpd_avx(auVar20);
      local_58c = local_5a0;
      local_584 = local_598;
      pvVar46 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                          (local_550,local_560);
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).x = (float)(undefined4)local_58c;
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).y = (float)local_58c._4_4_;
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).z = local_584;
    }
    else {
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                (&local_1d8,local_560);
      uVar56 = 0;
      PVar60 = weightBoundary((SDVertex *)
                              CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                              in_stack_fffffffffffff15c);
      local_578 = PVar60.super_Tuple3<pbrt::Point3,_float>.z;
      auVar21._8_8_ = uVar56;
      auVar21._0_8_ = PVar60.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_580 = vmovlpd_avx(auVar21);
      local_56c = local_580;
      local_564 = local_578;
      pvVar46 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                          (local_550,local_560);
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).x = (float)(undefined4)local_56c;
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).y = (float)local_56c._4_4_;
      (pvVar46->super_Tuple3<pbrt::Point3,_float>).z = local_564;
    }
  }
  for (local_5a8 = 0; uVar34 = local_5a8,
      sVar45 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::size(&local_1d8),
      uVar34 < sVar45; local_5a8 = local_5a8 + 1) {
    pvVar46 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                        (local_550,local_5a8);
    ppSVar38 = std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
                         (&local_1d8,local_5a8);
    pSVar1 = *ppSVar38;
    fVar30 = (pvVar46->super_Tuple3<pbrt::Point3,_float>).y;
    (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.x = (pvVar46->super_Tuple3<pbrt::Point3,_float>).x
    ;
    (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.y = fVar30;
    (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z = (pvVar46->super_Tuple3<pbrt::Point3,_float>).z
    ;
  }
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x8a4f1d);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::size(&local_1d8);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::reserve
            (in_stack_ffffffffffffefc0,(size_type)in_stack_ffffffffffffefb8);
  local_5e0 = 0;
  local_5e8 = 0;
  Point3<float>::Point3((Point3<float> *)0x8a4f68);
  std::allocator<pbrt::Point3<float>_>::allocator((allocator<pbrt::Point3<float>_> *)0x8a4f7d);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_,
             (value_type *)in_stack_ffffffffffffefa0,(allocator_type *)in_stack_ffffffffffffef98);
  std::allocator<pbrt::Point3<float>_>::~allocator((allocator<pbrt::Point3<float>_> *)0x8a4fae);
  local_5f8 = &local_1d8;
  local_600._M_current =
       (SDVertex **)
       std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::begin
                 ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                  in_stack_ffffffffffffef88);
  local_608 = (SDVertex **)
              std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::end
                        ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
                         in_stack_ffffffffffffef88);
  while (bVar32 = __gnu_cxx::operator!=
                            ((__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                              *)in_stack_ffffffffffffef90,
                             (__normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
                              *)in_stack_ffffffffffffef88), bVar32) {
    ppSVar42 = __gnu_cxx::
               __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
               ::operator*(&local_600);
    local_610 = *ppSVar42;
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_ffffffffffffef90,
               (float)((ulong)in_stack_ffffffffffffef88 >> 0x20),SUB84(in_stack_ffffffffffffef88,0),
               0.0);
    auVar53 = ZEXT1664((undefined1  [16])0x0);
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_ffffffffffffef90,
               (float)((ulong)in_stack_ffffffffffffef88 >> 0x20),SUB84(in_stack_ffffffffffffef88,0),
               0.0);
    iVar33 = SDVertex::valence(in_stack_ffffffffffffef98);
    local_62c = iVar33;
    sVar45 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                       (local_5d8);
    if ((int)sVar45 < iVar33) {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                (in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_);
    }
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[](local_5d8,0)
    ;
    SDVertex::oneRing(in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_);
    auVar58 = auVar53._8_56_;
    if ((local_610->boundary & 1U) == 0) {
      for (local_630 = 0; auVar58 = auVar53._8_56_, local_630 < local_62c; local_630 = local_630 + 1
          ) {
        auVar51._0_4_ = ((float)local_630 * 6.2831855) / (float)local_62c;
        auVar51._4_12_ = SUB6012((undefined1  [60])0x0,0);
        std::cos(auVar51._0_8_);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,(long)local_630);
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)in_stack_ffffffffffffef90,&in_stack_ffffffffffffef88->p);
        uVar56 = 0;
        VVar62 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_660[0].z = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._8_8_ = uVar56;
        auVar19._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_660[0]._0_8_ = vmovlpd_avx(auVar19);
        local_640._0_8_ = local_660[0]._0_8_;
        local_640.z = local_660[0].z;
        Tuple3<pbrt::Vector3,float>::operator+=
                  ((Tuple3<pbrt::Vector3,float> *)&local_61c,(Vector3<float> *)&local_640);
        auVar52._0_4_ = ((float)local_630 * 6.2831855) / (float)local_62c;
        auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
        std::sin(auVar52._0_8_);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,(long)local_630);
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)in_stack_ffffffffffffef90,&in_stack_ffffffffffffef88->p);
        uVar56 = 0;
        VVar62 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_690[0].z = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar53 = ZEXT464((uint)local_690[0].z);
        auVar18._8_8_ = uVar56;
        auVar18._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_690[0]._0_8_ = vmovlpd_avx(auVar18);
        local_670._0_8_ = local_690[0]._0_8_;
        local_670.z = local_690[0].z;
        Tuple3<pbrt::Vector3,float>::operator+=
                  ((Tuple3<pbrt::Vector3,float> *)&local_628,(Vector3<float> *)&local_670);
      }
    }
    else {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                (local_5d8,(long)(local_62c + -1));
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                (local_5d8,0);
      VVar62 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_ffffffffffffefa0,&in_stack_ffffffffffffef98->p);
      local_6a8 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar53._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar53._8_56_ = auVar58;
      uVar56 = 0;
      uVar57 = 0;
      local_6b0 = vmovlpd_avx(auVar53._0_16_);
      local_69c = local_6b0;
      local_694 = local_6a8;
      local_61c = local_6b0;
      local_614 = local_6a8;
      if (local_62c == 2) {
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,0);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,1);
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_6d0 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar17._8_8_ = uVar56;
        auVar17._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_6d8 = vmovlpd_avx(auVar17);
        local_6c8 = local_6d8;
        local_6c0 = local_6d0;
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_6f0 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = 0;
        auVar16._8_8_ = uVar57;
        auVar16._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_6f8 = vmovlpd_avx(auVar16);
        local_6e8 = local_6f8;
        local_6e0 = local_6f0;
        VVar62 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_ffffffffffffefa0,&in_stack_ffffffffffffef98->p
                           );
        local_700 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar58 = (undefined1  [56])0x0;
        auVar15._8_8_ = uVar56;
        auVar15._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_708 = vmovlpd_avx(auVar15);
        local_6bc = local_708;
        local_6b4 = local_700;
        local_628 = local_708;
        local_620 = local_700;
      }
      else if (local_62c == 3) {
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,1);
        VVar62 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_ffffffffffffefa0,&in_stack_ffffffffffffef98->p
                           );
        local_720 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar58 = (undefined1  [56])0x0;
        auVar14._8_8_ = uVar57;
        auVar14._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_728 = vmovlpd_avx(auVar14);
        local_714 = local_728;
        local_70c = local_720;
        local_628 = local_728;
        local_620 = local_720;
      }
      else if (local_62c == 4) {
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,0);
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_788 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = 0;
        auVar13._8_8_ = uVar57;
        auVar13._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_790 = vmovlpd_avx(auVar13);
        local_780 = local_790;
        local_778 = local_788;
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,1);
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_7a8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar12._8_8_ = uVar56;
        auVar12._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_7b0 = vmovlpd_avx(auVar12);
        local_7a0 = local_7b0;
        local_798 = local_7a8;
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_7b8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = 0;
        auVar11._8_8_ = uVar57;
        auVar11._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_7c0 = vmovlpd_avx(auVar11);
        local_770 = local_7c0;
        local_768 = local_7b8;
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,2);
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_7d8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar10._8_8_ = uVar56;
        auVar10._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_7e0 = vmovlpd_avx(auVar10);
        local_7d0 = local_7e0;
        local_7c8 = local_7d8;
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_7e8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = 0;
        auVar9._8_8_ = uVar57;
        auVar9._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_7f0 = vmovlpd_avx(auVar9);
        local_760 = local_7f0;
        local_758 = local_7e8;
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,3);
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_808 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar8._8_8_ = uVar56;
        auVar8._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_810 = vmovlpd_avx(auVar8);
        local_800 = local_810;
        local_7f8 = local_808;
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_818 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar56 = 0;
        auVar7._8_8_ = uVar57;
        auVar7._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_820 = vmovlpd_avx(auVar7);
        local_750 = local_820;
        local_748 = local_818;
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_838 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar6._8_8_ = uVar56;
        auVar6._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_840 = vmovlpd_avx(auVar6);
        local_830 = local_840;
        local_828 = local_838;
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_848 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        auVar58 = (undefined1  [56])0x0;
        auVar5._8_8_ = uVar57;
        auVar5._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_850 = vmovlpd_avx(auVar5);
        local_740 = local_850;
        local_738 = local_848;
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)in_stack_ffffffffffffef90,&in_stack_ffffffffffffef88->p);
        local_628 = local_734;
        local_620 = local_72c;
      }
      else {
        local_854 = 3.1415927 / (float)(local_62c + -1);
        std::sin((double)(ulong)(uint)local_854);
        uVar56 = extraout_XMM0_Qb;
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,0);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                  (local_5d8,(long)(local_62c + -1));
        PVar61 = Tuple3<pbrt::Point3,float>::operator+
                           ((Tuple3<pbrt::Point3,_float> *)in_stack_ffffffffffffefa0,
                            &in_stack_ffffffffffffef98->p);
        local_888 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        uVar57 = 0;
        auVar4._8_8_ = uVar56;
        auVar4._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_890 = vmovlpd_avx(auVar4);
        local_880 = local_890;
        local_878 = local_888;
        PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
        local_898 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
        auVar53 = ZEXT464((uint)local_898);
        auVar3._8_8_ = uVar57;
        auVar3._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_8a0 = vmovlpd_avx(auVar3);
        local_870 = local_8a0;
        local_868 = local_898;
        Vector3<float>::Vector3<float>
                  ((Vector3<float> *)in_stack_ffffffffffffef90,&in_stack_ffffffffffffef88->p);
        local_628 = local_860;
        local_620 = (float)local_858;
        for (local_8a4 = 1; auVar58 = auVar53._8_56_, local_8a4 < local_62c + -1;
            local_8a4 = local_8a4 + 1) {
          dVar50 = std::cos((double)(ulong)(uint)local_854);
          auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416(SUB84(dVar50,0)),
                                    SUB6416(ZEXT464(0xc0000000),0));
          dVar50 = std::sin((double)(ulong)(uint)((float)local_8a4 * local_854));
          local_8a8 = auVar63._0_4_ * SUB84(dVar50,0);
          std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                    (local_5d8,(long)local_8a4);
          uVar56 = 0;
          PVar61 = operator*(in_stack_ffffffffffffefa8._12_4_,in_stack_ffffffffffffefa8._0_8_);
          local_8c8 = PVar61.super_Tuple3<pbrt::Point3,_float>.z;
          auVar53 = ZEXT464((uint)local_8c8);
          auVar2._8_8_ = uVar56;
          auVar2._0_8_ = PVar61.super_Tuple3<pbrt::Point3,_float>._0_8_;
          local_8d0 = vmovlpd_avx(auVar2);
          local_8c0 = local_8d0;
          local_8b8 = local_8c8;
          Vector3<float>::Vector3<float>
                    ((Vector3<float> *)in_stack_ffffffffffffef90,&in_stack_ffffffffffffef88->p);
          Tuple3<pbrt::Vector3,float>::operator+=
                    ((Tuple3<pbrt::Vector3,float> *)&local_628,&local_8b4);
        }
        VVar62 = Tuple3<pbrt::Vector3,_float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_ffffffffffffef90);
        local_8e8 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar54._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar54._8_56_ = auVar58;
        auVar58 = (undefined1  [56])0x0;
        local_8f0 = vmovlpd_avx(auVar54._0_16_);
        local_8dc = local_8f0;
        local_8d4 = local_8e8;
        local_628 = local_8f0;
        local_620 = local_8e8;
      }
    }
    VVar62 = Cross<float>((Vector3<float> *)in_stack_ffffffffffffefa0,
                          (Vector3<float> *)in_stack_ffffffffffffef98);
    local_910 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar55._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar55._8_56_ = auVar58;
    local_918 = vmovlpd_avx(auVar55._0_16_);
    local_908 = local_918;
    local_900 = local_910;
    Normal3<float>::Normal3<float>
              ((Normal3<float> *)in_stack_ffffffffffffef90,
               (Vector3<float> *)in_stack_ffffffffffffef88);
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::push_back
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_ffffffffffffef90,(value_type *)in_stack_ffffffffffffef88);
    __gnu_cxx::
    __normal_iterator<pbrt::SDVertex_**,_std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>_>
    ::operator++(&local_600);
  }
  local_920 = (_List_node_base *)
              std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::size(&local_1c0);
  args_7 = (vector<int,_std::allocator<int>_> *)((long)local_920 * 3);
  std::allocator<int>::allocator((allocator<int> *)0x8a5ee6);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffefa8._8_8_,in_stack_ffffffffffffefa8._0_8_,
             (allocator_type *)in_stack_ffffffffffffefa0);
  std::allocator<int>::~allocator((allocator<int> *)0x8a5f0f);
  local_948 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x8a5f1c);
  local_950 = (_List_node_base *)
              std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::size(&local_1d8);
  std::
  map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
  ::map((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
         *)0x8a5f46);
  for (local_9d8.availableBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      local_9d8.availableBlocks.
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_prev < local_950;
      local_9d8.availableBlocks.
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&(local_9d8.availableBlocks.
                    super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1)) {
    in_stack_ffffffffffffeff4 =
         (mapped_type)
         local_9d8.availableBlocks.
         super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator[]
              (&local_1d8,
               (size_type)
               local_9d8.availableBlocks.
               super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
               ._M_impl._M_node.super__List_node_base._M_prev);
    in_stack_ffffffffffffeff8 =
         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
         std::
         map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
         ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                       *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8->v);
    *(mapped_type *)
     &(in_stack_ffffffffffffeff8->
      super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start = in_stack_ffffffffffffeff4;
  }
  for (local_9d8.availableBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      local_9d8.availableBlocks.
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_next < local_920;
      local_9d8.availableBlocks.
      super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           ((long)&(local_9d8.availableBlocks.
                    super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                    ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 1)) {
    for (local_9d8.usedBlocks.
         super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
         ._M_impl._M_node._M_size._4_4_ = 0;
        local_9d8.usedBlocks.
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node._M_size._4_4_ < 3;
        local_9d8.usedBlocks.
        super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ._M_impl._M_node._M_size._4_4_ =
             local_9d8.usedBlocks.
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node._M_size._4_4_ + 1) {
      std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator[]
                (&local_1c0,
                 (size_type)
                 local_9d8.availableBlocks.
                 super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
      pmVar47 = std::
                map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                              *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8->v);
      *local_948 = *pmVar47;
      local_948 = local_948 + 1;
    }
  }
  auVar63 = (undefined1  [16])0x0;
  local_9d8.currentBlock.size = 0;
  local_9d8.currentBlockPos = 0;
  local_9d8.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  this_00 = &local_9d8.currentBlock.size;
  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::vector
            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)0x8a60fa);
  local_9d8.super_memory_resource._vptr_memory_resource = auVar63._0_8_;
  local_9d8.upstreamResource = auVar63._8_8_;
  local_9d8.blockSize = 0;
  this = &local_9d8;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x8a6127);
  local_9f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       auVar63._0_8_;
  local_9f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = auVar63._8_8_;
  local_9f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  args_2 = &local_9f8;
  args_4 = (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
           local_9f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x8a6154);
  pTVar48 = pstd::pmr::polymorphic_allocator<std::byte>::
            new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                      ((polymorphic_allocator<std::byte> *)this_00,local_20,(bool *)this,args_2,
                       in_stack_ffffffffffffefb8,args_4,
                       (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                       CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                       in_stack_ffffffffffffeff8,args_7);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefa0);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_ffffffffffffefa0);
  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             in_stack_ffffffffffffefa0);
  std::
  map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
  ::~map((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
          *)0x8a61de);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefa0);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_ffffffffffffefa0);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
             in_stack_ffffffffffffefa0);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_ffffffffffffefa0);
  pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(this);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~vector
            ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
             in_stack_ffffffffffffefa0);
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~vector
            ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)in_stack_ffffffffffffefa0);
  std::set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>::~set
            ((set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> *)0x8a6246);
  std::unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_>::~unique_ptr
            ((unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_> *)this);
  std::unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_>::~unique_ptr
            ((unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_> *)this);
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~vector
            ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)in_stack_ffffffffffffefa0);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~vector
            ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)
             in_stack_ffffffffffffefa0);
  return pTVar48;
}

Assistant:

TriangleMesh *LoopSubdivide(const Transform *renderFromObject, bool reverseOrientation,
                            int nLevels, pstd::span<const int> vertexIndices,
                            pstd::span<const Point3f> p, Allocator alloc) {
    std::vector<SDVertex *> vertices;
    std::vector<SDFace *> faces;
    // Allocate _LoopSubdiv_ vertices and faces
    std::unique_ptr<SDVertex[]> verts = std::make_unique<SDVertex[]>(p.size());
    for (int i = 0; i < p.size(); ++i) {
        verts[i] = SDVertex(p[i]);
        vertices.push_back(&verts[i]);
    }
    size_t nFaces = vertexIndices.size() / 3;
    std::unique_ptr<SDFace[]> fs = std::make_unique<SDFace[]>(nFaces);
    for (int i = 0; i < nFaces; ++i)
        faces.push_back(&fs[i]);

    // Set face to vertex pointers
    const int *vp = vertexIndices.data();
    for (size_t i = 0; i < nFaces; ++i, vp += 3) {
        SDFace *f = faces[i];
        for (int j = 0; j < 3; ++j) {
            SDVertex *v = vertices[vp[j]];
            f->v[j] = v;
            v->startFace = f;
        }
    }

    // Set neighbor pointers in _faces_
    std::set<SDEdge> edges;
    for (int i = 0; i < nFaces; ++i) {
        SDFace *f = faces[i];
        for (int edgeNum = 0; edgeNum < 3; ++edgeNum) {
            // Update neighbor pointer for _edgeNum_
            int v0 = edgeNum, v1 = NEXT(edgeNum);
            SDEdge e(f->v[v0], f->v[v1]);
            if (edges.find(e) == edges.end()) {
                // Handle new edge
                e.f[0] = f;
                e.f0edgeNum = edgeNum;
                edges.insert(e);
            } else {
                // Handle previously seen edge
                e = *edges.find(e);
                e.f[0]->f[e.f0edgeNum] = f;
                f->f[edgeNum] = e.f[0];
                edges.erase(e);
            }
        }
    }

    // Finish vertex initialization
    for (size_t i = 0; i < p.size(); ++i) {
        SDVertex *v = vertices[i];
        SDFace *f = v->startFace;
        do {
            f = f->nextFace(v);
        } while ((f != nullptr) && f != v->startFace);
        v->boundary = (f == nullptr);
        if (!v->boundary && v->valence() == 6)
            v->regular = true;
        else if (v->boundary && v->valence() == 4)
            v->regular = true;
        else
            v->regular = false;
    }

    // Refine _LoopSubdiv_ into triangles
    std::vector<SDFace *> f = faces;
    std::vector<SDVertex *> v = vertices;
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator vertexFaceAllocator(&resource);

    for (int i = 0; i < nLevels; ++i) {
        // Update _f_ and _v_ for next level of subdivision
        std::vector<SDFace *> newFaces;
        std::vector<SDVertex *> newVertices;

        // Allocate next level of children in mesh tree
        for (SDVertex *vertex : v) {
            vertex->child = vertexFaceAllocator.new_object<SDVertex>();
            vertex->child->regular = vertex->regular;
            vertex->child->boundary = vertex->boundary;
            newVertices.push_back(vertex->child);
        }
        for (SDFace *face : f) {
            for (int k = 0; k < 4; ++k) {
                face->children[k] = vertexFaceAllocator.new_object<SDFace>();
                newFaces.push_back(face->children[k]);
            }
        }

        // Update vertex positions and create new edge vertices

        // Update vertex positions for even vertices
        for (SDVertex *vertex : v) {
            if (!vertex->boundary) {
                // Apply one-ring rule for even vertex
                if (vertex->regular)
                    vertex->child->p = weightOneRing(vertex, 1.f / 16.f);
                else
                    vertex->child->p = weightOneRing(vertex, beta(vertex->valence()));
            } else {
                // Apply boundary rule for even vertex
                vertex->child->p = weightBoundary(vertex, 1.f / 8.f);
            }
        }

        // Compute new odd edge vertices
        std::map<SDEdge, SDVertex *> edgeVerts;
        for (SDFace *face : f) {
            for (int k = 0; k < 3; ++k) {
                // Compute odd vertex on _k_th edge
                SDEdge edge(face->v[k], face->v[NEXT(k)]);
                SDVertex *vert = edgeVerts[edge];
                if (vert == nullptr) {
                    // Create and initialize new odd vertex
                    vert = vertexFaceAllocator.new_object<SDVertex>();
                    newVertices.push_back(vert);
                    vert->regular = true;
                    vert->boundary = (face->f[k] == nullptr);
                    vert->startFace = face->children[3];

                    // Apply edge rules to compute new vertex position
                    if (vert->boundary) {
                        vert->p = 0.5f * edge.v[0]->p;
                        vert->p += 0.5f * edge.v[1]->p;
                    } else {
                        vert->p = 3.f / 8.f * edge.v[0]->p;
                        vert->p += 3.f / 8.f * edge.v[1]->p;
                        vert->p += 1.f / 8.f * face->otherVert(edge.v[0], edge.v[1])->p;
                        vert->p +=
                            1.f / 8.f * face->f[k]->otherVert(edge.v[0], edge.v[1])->p;
                    }
                    edgeVerts[edge] = vert;
                }
            }
        }

        // Update new mesh topology

        // Update even vertex face pointers
        for (SDVertex *vertex : v) {
            int vertNum = vertex->startFace->vnum(vertex);
            vertex->child->startFace = vertex->startFace->children[vertNum];
        }

        // Update face neighbor pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update children _f_ pointers for siblings
                face->children[3]->f[j] = face->children[NEXT(j)];
                face->children[j]->f[NEXT(j)] = face->children[3];

                // Update children _f_ pointers for neighbor children
                SDFace *f2 = face->f[j];
                face->children[j]->f[j] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
                f2 = face->f[PREV(j)];
                face->children[j]->f[PREV(j)] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
            }
        }

        // Update face vertex pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update child vertex pointer to new even vertex
                face->children[j]->v[j] = face->v[j]->child;

                // Update child vertex pointer to new odd vertex
                SDVertex *vert = edgeVerts[SDEdge(face->v[j], face->v[NEXT(j)])];
                face->children[j]->v[NEXT(j)] = vert;
                face->children[NEXT(j)]->v[j] = vert;
                face->children[3]->v[j] = vert;
            }
        }

        // Prepare for next level of subdivision
        f = newFaces;
        v = newVertices;
    }

    // Push vertices to limit surface
    std::vector<Point3f> pLimit(v.size());
    for (size_t i = 0; i < v.size(); ++i) {
        if (v[i]->boundary)
            pLimit[i] = weightBoundary(v[i], 1.f / 5.f);
        else
            pLimit[i] = weightOneRing(v[i], loopGamma(v[i]->valence()));
    }
    for (size_t i = 0; i < v.size(); ++i)
        v[i]->p = pLimit[i];

    // Compute vertex tangents on limit surface
    std::vector<Normal3f> Ns;
    Ns.reserve(v.size());
    std::vector<Point3f> pRing(16, Point3f());
    for (SDVertex *vertex : v) {
        Vector3f S(0, 0, 0), T(0, 0, 0);
        int valence = vertex->valence();
        if (valence > (int)pRing.size())
            pRing.resize(valence);
        vertex->oneRing(&pRing[0]);
        if (!vertex->boundary) {
            // Compute tangents of interior face
            for (int j = 0; j < valence; ++j) {
                S += std::cos(2 * Pi * j / valence) * Vector3f(pRing[j]);
                T += std::sin(2 * Pi * j / valence) * Vector3f(pRing[j]);
            }
        } else {
            // Compute tangents of boundary face
            S = pRing[valence - 1] - pRing[0];
            if (valence == 2)
                T = Vector3f(pRing[0] + pRing[1] - 2 * vertex->p);
            else if (valence == 3)
                T = pRing[1] - vertex->p;
            else if (valence == 4)  // regular
                T = Vector3f(-1 * pRing[0] + 2 * pRing[1] + 2 * pRing[2] + -1 * pRing[3] +
                             -2 * vertex->p);
            else {
                Float theta = Pi / float(valence - 1);
                T = Vector3f(std::sin(theta) * (pRing[0] + pRing[valence - 1]));
                for (int k = 1; k < valence - 1; ++k) {
                    Float wt = (2 * std::cos(theta) - 2) * std::sin((k)*theta);
                    T += Vector3f(wt * pRing[k]);
                }
                T = -T;
            }
        }
        Ns.push_back(Normal3f(Cross(S, T)));
    }

    // Create triangle mesh from subdivision mesh
    {
        size_t ntris = f.size();
        std::vector<int> verts(3 * ntris);
        int *vp = verts.data();
        size_t totVerts = v.size();
        std::map<SDVertex *, int> usedVerts;
        for (size_t i = 0; i < totVerts; ++i)
            usedVerts[v[i]] = i;
        for (size_t i = 0; i < ntris; ++i) {
            for (int j = 0; j < 3; ++j) {
                *vp = usedVerts[f[i]->v[j]];
                ++vp;
            }
        }
        return alloc.new_object<TriangleMesh>(*renderFromObject, reverseOrientation,
                                              verts, pLimit, std::vector<Vector3f>(), Ns,
                                              std::vector<Point2f>(), std::vector<int>());
    }
}